

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::find_position<int>
          (sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *this,int *key)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  bool bVar5;
  const_reference ppVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  
  sVar4 = (this->table).settings.table_size;
  uVar8 = (ulong)*key;
  piVar1 = &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_hashes_;
  *piVar1 = *piVar1 + 1;
  uVar9 = 0xffffffffffffffff;
  lVar10 = 1;
  do {
    uVar8 = uVar8 & sVar4 - 1;
    bVar5 = sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::test(&this->table,uVar8);
    if (!bVar5) {
      uVar7 = uVar8;
      if (uVar9 != 0xffffffffffffffff) {
        uVar7 = uVar9;
      }
      uVar8 = 0xffffffffffffffff;
LAB_0098494e:
      pVar11.second = uVar7;
      pVar11.first = uVar8;
      return pVar11;
    }
    bVar5 = test_deleted(this,uVar8);
    if (bVar5) {
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = uVar8;
      }
    }
    else {
      ppVar6 = sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
               ::unsafe_get(&this->table,uVar8);
      iVar2 = *key;
      iVar3 = ppVar6->first;
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar2 == iVar3) {
        uVar7 = 0xffffffffffffffff;
        goto LAB_0098494e;
      }
    }
    uVar8 = uVar8 + lVar10;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }